

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void localfunc(LexState *ls,int defer)

{
  int iVar1;
  FuncState *fs_00;
  TString *pTVar2;
  LocVar *pLVar3;
  FuncState *fs;
  expdesc b;
  int defer_local;
  LexState *ls_local;
  
  b._52_4_ = defer;
  memset(&fs,0,0x38);
  b.t = -1;
  b.usertype._0_4_ = 0xffffffff;
  fs_00 = ls->fs;
  if (b._52_4_ == 0) {
    pTVar2 = str_checkname(ls);
    new_localvar(ls,pTVar2,0x200,(TString *)0x0);
  }
  else {
    pTVar2 = luaX_newstring(ls,"(deferred function)",0x13);
    new_localvar(ls,pTVar2,0x200,(TString *)0x0);
    markupval(fs_00,(uint)fs_00->nactvar);
    fs_00->bl->insidetbc = '\x01';
  }
  adjustlocalvars(ls,1);
  body(ls,(expdesc *)&fs,0,ls->linenumber,b._52_4_);
  iVar1 = fs_00->pc;
  pLVar3 = getlocvar(fs_00,b.k);
  pLVar3->startpc = iVar1;
  return;
}

Assistant:

static void localfunc (LexState *ls, int defer) {
  expdesc b = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  FuncState *fs = ls->fs;
  if (defer) {
    static const char funcname[] = "(deferred function)";
    new_localvar(ls, luaX_newstring(ls, funcname, sizeof funcname-1), RAVI_TM_FUNCTION, NULL);  /* new local variable */
    markupval(fs, fs->nactvar);
    fs->bl->insidetbc = 1;  /* in the scope of a defer closure variable */
  } else {
    /* RAVI change - add type */
    new_localvar(ls, str_checkname(ls), RAVI_TM_FUNCTION, NULL);  /* new local variable */
  }
  adjustlocalvars(ls, 1);  /* enter its scope */
  body(ls, &b, 0, ls->linenumber, defer);  /* function created in next register */
  /* debug information will only see the variable after this point! */
  getlocvar(fs, b.u.info)->startpc = fs->pc;
}